

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O1

com_pic_t *
com_picbuf_alloc(int width,int height,int pad_l,int pad_c,int i_scu,int f_scu,int bit_depth,
                int parallel,int *err)

{
  int iVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  com_pic_t *__s;
  size_t __n_00;
  void *__s_00;
  
  pvVar4 = malloc(0x23f);
  if (pvVar4 == (void *)0x0) {
    __s = (com_pic_t *)0x0;
  }
  else {
    __s = (com_pic_t *)((long)pvVar4 + 0x27U & 0xffffffffffffffe0);
    *(void **)((long)&__s[-1].cond + 0x28) = pvVar4;
    memset(__s,0,0x218);
  }
  if (__s != (com_pic_t *)0x0) {
    __s->bit_depth = bit_depth;
    __s->width_luma = width;
    __s->height_luma = height;
    __s->width_chroma = width / 2;
    __s->height_chroma = height / 2;
    __s->padsize_luma = pad_l;
    __s->padsize_chroma = pad_c;
    iVar3 = width + pad_l * 2;
    __s->stride_luma = iVar3;
    iVar2 = (width / 2 + pad_c * 2) * 2;
    __s->stride_chroma = iVar2;
    iVar1 = height + pad_l * 2;
    iVar6 = height / 2 + pad_c * 2;
    __n = (long)f_scu * 2;
    __n_00 = (long)(((long)f_scu << 0x23) + 0xba00000000 +
                   ((ulong)(uint)(iVar3 * iVar1 + (int)__n + iVar2 * iVar6) << 0x20)) >> 0x20;
    pvVar4 = malloc(__n_00 + 0x27);
    if (pvVar4 == (void *)0x0) {
      __s_00 = (void *)0x0;
    }
    else {
      __s_00 = (void *)((long)pvVar4 + 0x27U & 0xffffffffffffffe0);
      *(void **)((long)__s_00 + -8) = pvVar4;
      memset(__s_00,0,__n_00);
    }
    __s->mem_base = __s_00;
    if (__s_00 != (void *)0x0) {
      uVar5 = (long)__s_00 + (long)iVar1 * (long)iVar3 + 0x1f & 0xffffffffffffffe0;
      __s->y = (pel *)((long)((iVar3 + 1) * pad_l) + (long)__s_00);
      pvVar4 = (void *)(uVar5 + (long)iVar6 * (long)iVar2 + 0x1f & 0xffffffffffffffe0);
      __s->uv = (pel *)((long)((iVar2 + 2) * pad_c) + uVar5);
      memset(pvVar4,0xff,__n);
      __s->map_refi = (s8 (*) [2])((long)pvVar4 + (long)i_scu * 2 + 2);
      __s->map_mv = (s16 (*) [2] [2])
                    (((long)pvVar4 + __n + 0x1f & 0xffffffffffffffe0) + (long)i_scu * 8 + 8);
      if (parallel == 0) {
        __s->parallel_enable = 0;
LAB_001116b3:
        iVar3 = 0;
        goto LAB_00111690;
      }
      __s->parallel_enable = 1;
      iVar3 = pthread_mutex_init((pthread_mutex_t *)&__s->mutex,(pthread_mutexattr_t *)0x0);
      if (iVar3 == 0) {
        iVar3 = pthread_cond_init((pthread_cond_t *)&__s->cond,(pthread_condattr_t *)0x0);
        if (iVar3 == 0) goto LAB_001116b3;
        pthread_mutex_destroy((pthread_mutex_t *)&__s->mutex);
      }
    }
    if (__s->mem_base != (void *)0x0) {
      free(*(void **)((long)__s->mem_base + -8));
      __s->mem_base = (void *)0x0;
    }
    free(*(void **)((long)&__s[-1].cond + 0x28));
  }
  iVar3 = -1;
  __s = (com_pic_t *)0x0;
LAB_00111690:
  if (err != (int *)0x0) {
    *err = iVar3;
  }
  return __s;
}

Assistant:

com_pic_t * com_picbuf_alloc(int width, int height, int pad_l, int pad_c, int i_scu, int f_scu, int bit_depth, int parallel, int *err)
{
    int total_mem_size = 0;
    u8 *buf;
    com_pic_t *pic = com_malloc(sizeof(com_pic_t));

    uavs3d_assert_goto(pic != NULL, ERR);

    pic->bit_depth      = bit_depth;
    pic->width_luma     = width;
    pic->height_luma    = height;
    pic->width_chroma   = width  / 2;
    pic->height_chroma  = height / 2;
    pic->padsize_luma   = pad_l;
    pic->padsize_chroma = pad_c;
    pic->stride_luma    = width + pad_l * 2;
    pic->stride_chroma  = (width / 2 + pad_c * 2) * 2;

    /* allocate maps */
    total_mem_size = sizeof(pel) * (pic->stride_luma * (height + 2 * pad_l) + pic->stride_chroma * (height / 2 + pad_c * 2)) + // yuv buffer
                     sizeof( s8) * f_scu * REFP_NUM        + ALIGN_MASK + // map_refi
                     sizeof(s16) * f_scu * REFP_NUM * MV_D + ALIGN_MASK + // map_mv
                     ALIGN_MASK * 4;

    pic->mem_base = buf = com_malloc(total_mem_size);
    uavs3d_assert_goto(pic->mem_base, ERR);

    buf = ALIGN_POINTER(buf);

    GIVE_BUFFER (pic->y,        buf, sizeof(pel) * pic->stride_luma   * (height     + pad_l * 2));  pic->y        += pad_l * pic->stride_luma   + pad_l;
    GIVE_BUFFER (pic->uv,       buf, sizeof(pel) * pic->stride_chroma * (height / 2 + pad_c * 2));  pic->uv       += pad_c * pic->stride_chroma + pad_c * 2;
    GIVE_BUFFERV(pic->map_refi, buf, sizeof( s8) * f_scu * REFP_NUM ,   -1);                        pic->map_refi += i_scu + 1;
    GIVE_BUFFER (pic->map_mv,   buf, sizeof(s16) * f_scu * REFP_NUM * MV_D);                        pic->map_mv   += i_scu + 1;

    if (parallel) {
        pic->parallel_enable = 1;
        if (!uavs3d_pthread_mutex_init(&pic->mutex, NULL)) {
            if (uavs3d_pthread_cond_init(&pic->cond, NULL)) {
                uavs3d_pthread_mutex_destroy(&pic->mutex);
                uavs3d_assert_goto(0, ERR);
            }
        } else {
            uavs3d_assert_goto(0, ERR);
        }
    } else {
        pic->parallel_enable = 0;
    }
    if (err) {
        *err = RET_OK;
    }

    return pic;
ERR:
    if (pic) {
        com_free(pic->mem_base);   
        com_free(pic);
    }
    if (err) {
        *err = ERR_OUT_OF_MEMORY;
    }
    return NULL;
}